

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateLossLayer(Result *__return_storage_ptr__,LossLayer *lossLayer,
                          NeuralNetworkValidatorGraph *graph)

{
  LayerNode *pLVar1;
  bool bVar2;
  CategoricalCrossEntropyLossLayer *pCVar3;
  LayerNode *pLVar4;
  pointer ppLVar5;
  MeanSquaredErrorLossLayer *pMVar6;
  const_iterator cVar7;
  vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_> *__range2;
  _Rb_tree_header *p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  string lossLayerName;
  string targetName;
  string lossInputName;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  Result r;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (lossLayer->_oneof_case_[0] == 0xb) {
    pMVar6 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
    std::__cxx11::string::string((string *)&lossInputName,(string *)(pMVar6->input_).ptr_);
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
            ::find(&(graph->blobNameToProducingNode)._M_t,&lossInputName);
    p_Var8 = &(graph->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar7._M_node != p_Var8) {
      pMVar6 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
      std::__cxx11::string::string((string *)&lossLayerName,(string *)(pMVar6->target_).ptr_);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
              ::find(&(graph->blobNameToProducingNode)._M_t,&lossLayerName);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var8) {
LAB_005655df:
        std::__cxx11::string::~string((string *)&lossLayerName);
        std::__cxx11::string::~string((string *)&lossInputName);
        CoreML::Result::Result(__return_storage_ptr__,&r);
        goto LAB_005655a9;
      }
      std::operator+(&bStack_128,"For the MSE loss layer named \'",(lossLayer->name_).ptr_);
      std::operator+(&targetName,&bStack_128,"\', target is generated within the graph.");
      std::__cxx11::string::operator=((string *)&err,(string *)&targetName);
      std::__cxx11::string::~string((string *)&targetName);
      std::__cxx11::string::~string((string *)&bStack_128);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      goto LAB_00565595;
    }
    std::operator+(&targetName,"For the MSE loss layer named \'",(lossLayer->name_).ptr_);
    std::operator+(&lossLayerName,&targetName,"\', input is not generated within the graph.");
    std::__cxx11::string::operator=((string *)&err,(string *)&lossLayerName);
    std::__cxx11::string::~string((string *)&lossLayerName);
    std::__cxx11::string::~string((string *)&targetName);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else {
    if (lossLayer->_oneof_case_[0] != 10) {
      std::operator+(&lossLayerName,"Loss function is not recognized in the loss layer named \'",
                     (lossLayer->name_).ptr_);
      std::operator+(&lossInputName,&lossLayerName,
                     "\', only cross entropy loss and MSE are supported.");
      std::__cxx11::string::operator=((string *)&err,(string *)&lossInputName);
      std::__cxx11::string::~string((string *)&lossInputName);
      std::__cxx11::string::~string((string *)&lossLayerName);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      goto LAB_005655a9;
    }
    pCVar3 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
    std::__cxx11::string::string((string *)&lossInputName,(string *)(pCVar3->input_).ptr_);
    std::__cxx11::string::string((string *)&lossLayerName,(string *)(lossLayer->name_).ptr_);
    std::__cxx11::string::string((string *)&local_68,(string *)&lossLayerName);
    pLVar4 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName(graph,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pLVar4 == (LayerNode *)0x0) {
      std::operator+(&bStack_128,"Failed to look up node for \'",&lossLayerName);
      std::operator+(&targetName,&bStack_128,"\'.");
      std::__cxx11::string::operator=((string *)&err,(string *)&targetName);
      std::__cxx11::string::~string((string *)&targetName);
      std::__cxx11::string::~string((string *)&bStack_128);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
    }
    else {
      ppLVar5 = (pLVar4->parents).
                super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppLVar5 ==
            (pLVar4->parents).
            super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator+(&bStack_128,"For the categorical cross entropy loss layer named \'",
                         (lossLayer->name_).ptr_);
          std::operator+(&targetName,&bStack_128,"\', input is not generated from a softmax output."
                        );
          std::__cxx11::string::operator=((string *)&err,(string *)&targetName);
          std::__cxx11::string::~string((string *)&targetName);
          std::__cxx11::string::~string((string *)&bStack_128);
          CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
          goto LAB_00565595;
        }
        pLVar1 = *ppLVar5;
        ppLVar5 = ppLVar5 + 1;
      } while (pLVar1->layerType != kSoftmax);
      bVar2 = std::operator!=((pLVar1->outputNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,&lossInputName);
      if (bVar2) {
        std::operator+(&bStack_128,"For the categorical cross entropy loss layer named \'",
                       (lossLayer->name_).ptr_);
        std::operator+(&targetName,&bStack_128,"\', input is not generated from a softmax output.");
        std::__cxx11::string::operator=((string *)&err,(string *)&targetName);
        std::__cxx11::string::~string((string *)&targetName);
        std::__cxx11::string::~string((string *)&bStack_128);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      }
      else {
        pCVar3 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
        std::__cxx11::string::string((string *)&targetName,(string *)(pCVar3->target_).ptr_);
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                ::find(&(graph->blobNameToProducingNode)._M_t,&targetName);
        if ((_Rb_tree_header *)cVar7._M_node ==
            &(graph->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::~string((string *)&targetName);
          goto LAB_005655df;
        }
        std::operator+(&local_88,"For the cross entropy loss layer named \'",(lossLayer->name_).ptr_
                      );
        std::operator+(&bStack_128,&local_88,"\', target is generated within the graph.");
        std::__cxx11::string::operator=((string *)&err,(string *)&bStack_128);
        std::__cxx11::string::~string((string *)&bStack_128);
        std::__cxx11::string::~string((string *)&local_88);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        std::__cxx11::string::~string((string *)&targetName);
      }
    }
LAB_00565595:
    std::__cxx11::string::~string((string *)&lossLayerName);
  }
  std::__cxx11::string::~string((string *)&lossInputName);
LAB_005655a9:
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

static Result validateLossLayer(const Specification::LossLayer *lossLayer, const NeuralNetworkValidatorGraph *graph) {
    Result r;
    std::string err;
    
    switch (lossLayer->LossLayerType_case()) {
        case CoreML::Specification::LossLayer::kCategoricalCrossEntropyLossLayer:
        {
            std::string lossInputName = lossLayer->categoricalcrossentropylosslayer().input();

            // validate loss input.
            std::string lossLayerName = lossLayer->name();
            const auto *lossNode = graph->getNodeFromName(lossLayerName);
            if (lossNode == NULL) {
                err = "Failed to look up node for '" + lossLayerName + "'.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            bool lossInputValidated = false;
            const auto &parents = lossNode->parents;
            for (const auto *node : parents) {
                if (node->layerType == Specification::NeuralNetworkLayer::kSoftmax) {
                    if (node->outputNames[0] != lossInputName) {
                        err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                    }
                    lossInputValidated = true;
                    break;
                }
            }

            if (!lossInputValidated) {
                err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }

            // validate loss target
            std::string targetName = lossLayer->categoricalcrossentropylosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the cross entropy loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        case CoreML::Specification::LossLayer::kMeanSquaredErrorLossLayer:
        {
            std::string inputName = lossLayer->meansquarederrorlosslayer().input();
            if (graph->blobNameToProducingNode.find(inputName) == graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', input is not generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            std::string targetName = lossLayer->meansquarederrorlosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        default:
            err = "Loss function is not recognized in the loss layer named '" + lossLayer->name() + "', only cross entropy loss and MSE are supported.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}